

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool __thiscall
OpenCLEnum::queryDeviceInfo
          (OpenCLEnum *this,cl_device_id device_id,uint param,string *value,string *param_name,
          size_t max_size)

{
  size_type __n;
  size_t sVar1;
  string *this_00;
  cl_device_info cVar2;
  cl_device_id device;
  ostream *poVar3;
  char *pcVar4;
  cl_int code;
  cl_int code_00;
  bool bVar5;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  char *local_d0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  undefined4 local_bc;
  string local_b8;
  allocator_type local_91;
  undefined1 local_90 [8];
  vector<char,_std::allocator<char>_> data;
  string local_68;
  uint local_44;
  size_t sStack_40;
  cl_int res;
  size_t max_size_local;
  string *param_name_local;
  string *value_local;
  cl_device_id p_Stack_20;
  uint param_local;
  cl_device_id device_id_local;
  OpenCLEnum *this_local;
  
  sStack_40 = max_size;
  max_size_local = (size_t)param_name;
  param_name_local = value;
  value_local._4_4_ = param;
  p_Stack_20 = device_id;
  device_id_local = (cl_device_id)this;
  if (max_size == 0) {
    local_44 = clGetDeviceInfo(device_id,param,0,(void *)0x0,&stack0xffffffffffffffc0);
    if (local_44 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"clGetDeviceInfo(");
      poVar3 = std::operator<<(poVar3,(string *)max_size_local);
      poVar3 = std::operator<<(poVar3,") failed: ");
      ocl::errorString_abi_cxx11_(&local_68,(ocl *)(ulong)local_44,code);
      poVar3 = std::operator<<(poVar3,(string *)&local_68);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_68);
      this_local._7_1_ = 0;
      goto LAB_001722ed;
    }
    local_44 = 0;
  }
  __n = sStack_40;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_90,__n,&local_91);
  std::allocator<char>::~allocator(&local_91);
  device = p_Stack_20;
  cVar2 = value_local._4_4_;
  sVar1 = sStack_40;
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_90);
  local_44 = clGetDeviceInfo(device,cVar2,sVar1,pcVar4,&stack0xffffffffffffffc0);
  this_00 = param_name_local;
  bVar5 = local_44 == 0;
  if (bVar5) {
    local_c8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_90);
    local_d8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_90);
    local_d0 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(&local_d8,sStack_40);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)this_00,local_c8,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_d0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)param_name_local,pcVar4);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"clGetDeviceInfo(");
    poVar3 = std::operator<<(poVar3,(string *)max_size_local);
    poVar3 = std::operator<<(poVar3,") failed: ");
    ocl::errorString_abi_cxx11_(&local_b8,(ocl *)(ulong)local_44,code_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_b8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  local_bc = 1;
  this_local._7_1_ = bVar5;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_90)
  ;
LAB_001722ed:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OpenCLEnum::queryDeviceInfo(cl_device_id device_id, unsigned int param, std::string &value, const std::string &param_name, size_t max_size)
{
	cl_int res;
	if (max_size == 0) {
		res = clGetDeviceInfo(device_id, param, 0, NULL, &max_size);
		if (res != CL_SUCCESS) {
			std::cerr << "clGetDeviceInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
			return false;
		}
	}

	std::vector<char> data(max_size);
	res = clGetDeviceInfo(device_id, param, max_size, data.data(), &max_size);
	if (res != CL_SUCCESS) {
		std::cerr << "clGetDeviceInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
		return false;
	}

	value.assign(data.begin(), data.begin() + max_size);
	value = value.c_str();	// remove trailing null chars
	return true;
}